

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementCopying.cpp
# Opt level: O2

void __thiscall TestCopying::testCopyingTextElement(TestCopying *this)

{
  bool bVar1;
  QBrush brush;
  TextElement elem3;
  TextElement elem2;
  QArrayDataPointer<char16_t> local_38;
  TextElement elem1;
  
  _elem2 = (Data *)0x0;
  _elem3 = (Data *)0x0;
  KDReports::TextElement::TextElement(&elem1,(QString *)&elem2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&elem2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&elem3);
  QBrush::QBrush(&brush,7,1);
  KDReports::Element::setBackground((QBrush *)&elem1);
  KDReports::Element::background();
  bVar1 = QTest::qCompare<QBrush,QBrush>
                    ((QBrush *)&elem2,&brush,"elem1.background()","brush",
                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/ElementCopying/ElementCopying.cpp"
                     ,0x1f);
  QBrush::~QBrush((QBrush *)&elem2);
  if (bVar1) {
    KDReports::TextElement::TextElement(&elem2,&elem1);
    KDReports::Element::background();
    bVar1 = QTest::qCompare<QBrush,QBrush>
                      ((QBrush *)&elem3,&brush,"elem2.background()","brush",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/ElementCopying/ElementCopying.cpp"
                       ,0x21);
    QBrush::~QBrush((QBrush *)&elem3);
    if (bVar1) {
      local_38.d = (Data *)0x0;
      local_38.ptr = (char16_t *)0x0;
      local_38.size = 0;
      KDReports::TextElement::TextElement(&elem3,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      KDReports::TextElement::operator=(&elem3,&elem2);
      KDReports::Element::background();
      QTest::qCompare<QBrush,QBrush>
                ((QBrush *)&local_38,&brush,"elem3.background()","brush",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/ElementCopying/ElementCopying.cpp"
                 ,0x24);
      QBrush::~QBrush((QBrush *)&local_38);
      KDReports::TextElement::~TextElement(&elem3);
    }
    KDReports::TextElement::~TextElement(&elem2);
  }
  QBrush::~QBrush(&brush);
  KDReports::TextElement::~TextElement(&elem1);
  return;
}

Assistant:

void testCopyingTextElement()
    {
        TextElement elem1(QStringLiteral("foo"));
        QBrush brush(Qt::red);
        elem1.setBackground(brush);
        QCOMPARE(elem1.background(), brush);
        TextElement elem2(elem1); // copy ctor
        QCOMPARE(elem2.background(), brush);
        TextElement elem3;
        elem3 = elem2; // operator=
        QCOMPARE(elem3.background(), brush);
    }